

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O0

double AccumulateSSE(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  uint32_t uVar1;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  double total_sse;
  int y;
  double local_30;
  int local_28;
  uint8_t *local_18;
  uint8_t *local_8;
  
  local_30 = 0.0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    uVar1 = (*VP8AccumulateSSE)(local_8,local_18,in_R8D);
    local_30 = (double)uVar1 + local_30;
    local_8 = local_8 + in_ESI;
    local_18 = local_18 + in_ECX;
  }
  return local_30;
}

Assistant:

static double AccumulateSSE(const uint8_t* src, int src_stride,
                            const uint8_t* ref, int ref_stride,
                            int w, int h) {
  int y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    total_sse += VP8AccumulateSSE(src, ref, w);
    src += src_stride;
    ref += ref_stride;
  }
  return total_sse;
}